

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

CB_COEFF_BUFFER * av1_get_cb_coeff_buffer(AV1_COMP *cpi,int mi_row,int mi_col)

{
  byte bVar1;
  int offset;
  int stride;
  int mib_size_log2;
  AV1_COMMON *cm;
  int mi_col_local;
  int mi_row_local;
  AV1_COMP *cpi_local;
  
  bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
  return cpi->coeff_buffer_base +
         ((mi_row >> (bVar1 & 0x1f)) *
          ((cpi->common).mi_params.mi_cols +
           (1 << ((byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f)) + -1 >>
          ((byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f)) + (mi_col >> (bVar1 & 0x1f)));
}

Assistant:

CB_COEFF_BUFFER *av1_get_cb_coeff_buffer(const struct AV1_COMP *cpi, int mi_row,
                                         int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const int stride =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, cm->seq_params->mib_size_log2);
  const int offset =
      (mi_row >> mib_size_log2) * stride + (mi_col >> mib_size_log2);
  return cpi->coeff_buffer_base + offset;
}